

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O1

bool el::base::utils::OS::termSupportsColor(void)

{
  int iVar1;
  char *in_R8;
  bool bVar2;
  string term;
  string local_28;
  
  getEnvironmentVariable_abi_cxx11_(&local_28,(OS *)"TERM","",(char *)0x0,in_R8);
  iVar1 = std::__cxx11::string::compare((char *)&local_28);
  bVar2 = true;
  if (iVar1 != 0) {
    iVar1 = std::__cxx11::string::compare((char *)&local_28);
    if (iVar1 != 0) {
      iVar1 = std::__cxx11::string::compare((char *)&local_28);
      if (iVar1 != 0) {
        iVar1 = std::__cxx11::string::compare((char *)&local_28);
        if (iVar1 != 0) {
          iVar1 = std::__cxx11::string::compare((char *)&local_28);
          if (iVar1 != 0) {
            iVar1 = std::__cxx11::string::compare((char *)&local_28);
            if (iVar1 != 0) {
              iVar1 = std::__cxx11::string::compare((char *)&local_28);
              bVar2 = iVar1 == 0;
            }
          }
        }
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_28._M_dataplus._M_p != &local_28.field_2) {
    operator_delete(local_28._M_dataplus._M_p);
  }
  return bVar2;
}

Assistant:

static inline bool termSupportsColor(void) {
    std::string term = getEnvironmentVariable("TERM", "");
    return term == "xterm" || term == "xterm-color" || term == "xterm-256color"
           || term == "screen" || term == "linux" || term == "cygwin"
           || term == "screen-256color";
  }